

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_socket.c
# Opt level: O0

int qc_poll_remove(QcPoll *poll,unsigned_long index)

{
  ulong local_20;
  unsigned_long i;
  unsigned_long index_local;
  QcPoll *poll_local;
  
  if (poll == (QcPoll *)0x0) {
    fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
            ,0x14c);
    __assert_fail("poll",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                  ,0x14c,"int qc_poll_remove(QcPoll *, unsigned long)");
  }
  if (index == 0) {
    fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
            ,0x14d);
    __assert_fail("index>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                  ,0x14d,"int qc_poll_remove(QcPoll *, unsigned long)");
  }
  local_20 = index;
  if ((index <= poll->num) &&
     (fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
              ,0x14e), index <= poll->num)) {
    __assert_fail("poll->num < index",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_rt/qc_socket.c"
                  ,0x14e,"int qc_poll_remove(QcPoll *, unsigned long)");
  }
  for (; local_20 < poll->num; local_20 = local_20 + 1) {
    poll->fdarray[local_20 - 1].fd = poll->fdarray[local_20].fd;
    poll->fdarray[local_20 - 1].events = poll->fdarray[local_20].events;
    poll->fdarray[local_20 - 1].revents = poll->fdarray[local_20].revents;
  }
  poll->num = poll->num - 1;
  return 0;
}

Assistant:

int qc_poll_remove(QcPoll *poll, unsigned long index)
{
    unsigned long i;

    qc_assert(poll);
    qc_assert(index>0);
    qc_assert(poll->num < index);

    for(i = index; i<poll->num; i++)
    {
        poll->fdarray[i-1].fd = poll->fdarray[i].fd;
        poll->fdarray[i-1].events  = poll->fdarray[i].events;
        poll->fdarray[i-1].revents = poll->fdarray[i].revents;
    }

    poll->num--;
    return 0;
}